

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O2

void __thiscall
cppcms::http::cookie::cookie
          (cookie *this,string *name,string *value,string *path,string *domain,string *comment)

{
  (this->d).ptr_ = (_data *)0x0;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::__cxx11::string::string((string *)&this->value_,(string *)value);
  std::__cxx11::string::string((string *)&this->path_,(string *)path);
  std::__cxx11::string::string((string *)&this->domain_,(string *)domain);
  std::__cxx11::string::string((string *)&this->comment_,(string *)comment);
  this->field_0xb8 = this->field_0xb8 & 0x80;
  return;
}

Assistant:

cookie::cookie(std::string name,std::string value,std::string path,std::string domain,std::string comment) :
	name_(name), value_(value), path_(path),domain_(domain),comment_(comment), secure_(0), has_age_(0), has_expiration_(0), httponly_(0), samesite_none_(0), samesite_lax_(0), samesite_strict_(0)
{
}